

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::sendCommand
          (CoreBroker *this,string_view target,string_view commandStr,HelicsSequencingModes mode)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view str;
  string_view str_00;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  bool bVar1;
  GlobalBrokerId id;
  ActionMessage *cmd;
  char *in_RDX;
  size_t in_RSI;
  CoreBroker *in_RDI;
  ActionMessage cmdcmd;
  CoreBroker *in_stack_000003f8;
  string_view in_stack_00000400;
  string_view in_stack_00000410;
  HelicsSequencingModes in_stack_00000430;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  BrokerBase *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf8;
  action_t in_stack_fffffffffffffdfc;
  ActionMessage *in_stack_fffffffffffffe00;
  SmallBuffer *in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  GlobalFederateId local_14c [3];
  BaseType local_140;
  size_t local_80;
  char *local_78;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_len = in_RSI;
  local_10._M_str = in_RDX;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,in_stack_fffffffffffffde8);
  __x._M_str = in_stack_fffffffffffffe10;
  __x._M_len = (size_t)in_stack_fffffffffffffe08;
  __y._M_len._4_4_ = in_stack_fffffffffffffdfc;
  __y._M_len._0_4_ = in_stack_fffffffffffffdf8;
  __y._M_str = (char *)in_stack_fffffffffffffe00;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    local_80 = local_10._M_len;
    local_78 = local_10._M_str;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,in_stack_fffffffffffffde8)
    ;
    query_abi_cxx11_(in_stack_000003f8,in_stack_00000410,in_stack_00000400,in_stack_00000430);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffde0);
    return;
  }
  ActionMessage::ActionMessage(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
  id = CLI::std::atomic<helics::GlobalBrokerId>::load(&(in_RDI->super_BrokerBase).global_id,seq_cst)
  ;
  GlobalFederateId::GlobalFederateId(local_14c,id);
  local_140 = local_14c[0].gid;
  SmallBuffer::operator=
            (in_stack_fffffffffffffe08,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe00);
  str._M_str = in_stack_fffffffffffffe10;
  str._M_len = (size_t)in_stack_fffffffffffffe08;
  ActionMessage::setString(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,str);
  cmd = (ActionMessage *)getIdentifier_abi_cxx11_(in_RDI);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffde0);
  str_00._M_str = in_stack_fffffffffffffe10;
  str_00._M_len = (size_t)in_stack_fffffffffffffe08;
  ActionMessage::setString(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,str_00);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)cmd);
  __x_00._M_str = in_stack_fffffffffffffe10;
  __x_00._M_len = (size_t)in_stack_fffffffffffffe08;
  __y_00._M_len._4_4_ = in_stack_fffffffffffffdfc;
  __y_00._M_len._0_4_ = in_stack_fffffffffffffdf8;
  __y_00._M_str = (char *)in_stack_fffffffffffffe00;
  bVar1 = std::operator==(__x_00,__y_00);
  if (!bVar1) {
    in_stack_fffffffffffffde0 = (BrokerBase *)getIdentifier_abi_cxx11_(in_RDI);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffde0);
    __x_01._M_str = in_stack_fffffffffffffe10;
    __x_01._M_len = (size_t)in_stack_fffffffffffffe08;
    __y_01._M_len._4_4_ = in_stack_fffffffffffffdfc;
    __y_01._M_len._0_4_ = in_stack_fffffffffffffdf8;
    __y_01._M_str = (char *)in_stack_fffffffffffffe00;
    bVar1 = std::operator==(__x_01,__y_01);
    if ((!bVar1) &&
       (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10), !bVar1)) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)cmd);
      __x_02._M_str = in_stack_fffffffffffffe10;
      __x_02._M_len = (size_t)in_stack_fffffffffffffe08;
      __y_02._M_len._4_4_ = in_stack_fffffffffffffdfc;
      __y_02._M_len._0_4_ = in_stack_fffffffffffffdf8;
      __y_02._M_str = (char *)in_stack_fffffffffffffe00;
      bVar1 = std::operator==(__x_02,__y_02);
      if ((!bVar1) || (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)cmd), !bVar1)) {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)cmd);
        __x_03._M_str = local_10._M_str;
        __x_03._M_len = local_10._M_len;
        __y_03._M_len._4_4_ = in_stack_fffffffffffffdfc;
        __y_03._M_len._0_4_ = in_stack_fffffffffffffdf8;
        __y_03._M_str = (char *)in_stack_fffffffffffffe00;
        bVar1 = std::operator==(__x_03,__y_03);
        if ((!bVar1) || (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)cmd), !bVar1)) {
          transmitToParent(in_RDI,cmd);
          goto LAB_005253d5;
        }
      }
    }
  }
  BrokerBase::addActionMessage
            (in_stack_fffffffffffffde0,
             (ActionMessage *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
LAB_005253d5:
  ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffde0);
  return;
}

Assistant:

void CoreBroker::sendCommand(std::string_view target,
                             std::string_view commandStr,
                             HelicsSequencingModes mode)
{
    if (commandStr == "flush") {
        query(target, "global_flush", HelicsSequencingModes::HELICS_SEQUENCING_MODE_ORDERED);
        return;
    }
    ActionMessage cmdcmd(mode == HELICS_SEQUENCING_MODE_ORDERED ? CMD_SEND_COMMAND_ORDERED :
                                                                  CMD_SEND_COMMAND);
    cmdcmd.source_id = global_id.load();
    cmdcmd.payload = commandStr;
    cmdcmd.setString(targetStringLoc, target);
    cmdcmd.setString(sourceStringLoc, getIdentifier());

    if (target == "broker" || target == getIdentifier() || target.empty() ||
        (target == "root" && _isRoot) || (target == "federation" && _isRoot)) {
        addActionMessage(std::move(cmdcmd));
    } else {
        transmitToParent(std::move(cmdcmd));
    }
}